

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

void __thiscall iDynTree::KinDynComputations::resizeInternalDataStructures(KinDynComputations *this)

{
  KinDynComputationsPrivateAttributes *pKVar1;
  SpatialAcc *pSVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  uint i;
  ulong uVar7;
  undefined8 *puVar8;
  SpatialAcc *pSVar9;
  
  iDynTree::FreeFloatingPos::resize((Model *)&this->pimpl->m_pos);
  iDynTree::FreeFloatingVel::resize((Model *)&this->pimpl->m_vel);
  iDynTree::LinkPositions::resize((Model *)&this->pimpl->m_linkPos);
  iDynTree::LinkVelArray::resize((Model *)&this->pimpl->m_linkVel);
  iDynTree::LinkInertias::resize((Model *)&this->pimpl->m_linkCRBIs);
  iDynTree::FreeFloatingMassMatrix::resize((Model *)&this->pimpl->m_rawMassMatrix);
  iDynTree::MatrixDynSize::zero();
  pKVar1 = this->pimpl;
  iDynTree::Model::getNrOfDOFs();
  iDynTree::MatrixDynSize::resize((ulong)&pKVar1->m_jacBuffer,6);
  iDynTree::MatrixDynSize::zero();
  pKVar1 = this->pimpl;
  pSVar2 = &pKVar1->m_baseBiasAcc;
  uVar7 = 0;
  do {
    pSVar9 = (SpatialAcc *)
             ((pKVar1->m_baseBiasAcc).super_SpatialMotionVector.
              super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data +
             ((int)uVar7 - 3));
    if (uVar7 < 3) {
      pSVar9 = pSVar2;
    }
    (pSVar9->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
    linearVec3.super_Vector3.m_data[0] = 0.0;
    uVar7 = uVar7 + 1;
    pSVar2 = (SpatialAcc *)
             ((pSVar2->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>
              .linearVec3.super_Vector3.m_data + 1);
  } while (uVar7 != 6);
  iDynTree::LinkAccArray::resize((Model *)&pKVar1->m_linkBiasAcc);
  pKVar1 = this->pimpl;
  pSVar2 = &pKVar1->m_baseAcc;
  uVar7 = 0;
  do {
    pSVar9 = (SpatialAcc *)
             ((pKVar1->m_baseAcc).super_SpatialMotionVector.
              super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data +
             ((int)uVar7 - 3));
    if (uVar7 < 3) {
      pSVar9 = pSVar2;
    }
    (pSVar9->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
    linearVec3.super_Vector3.m_data[0] = 0.0;
    uVar7 = uVar7 + 1;
    pSVar2 = (SpatialAcc *)
             ((pSVar2->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>
              .linearVec3.super_Vector3.m_data + 1);
  } while (uVar7 != 6);
  iDynTree::FreeFloatingAcc::resize((Model *)&pKVar1->m_generalizedAccs);
  iDynTree::LinkAccArray::resize((Model *)&this->pimpl->m_linkAccs);
  pKVar1 = this->pimpl;
  pSVar2 = &pKVar1->m_invDynBaseAcc;
  uVar7 = 0;
  do {
    pSVar9 = (SpatialAcc *)
             ((pKVar1->m_invDynBaseAcc).super_SpatialMotionVector.
              super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data +
             ((int)uVar7 - 3));
    if (uVar7 < 3) {
      pSVar9 = pSVar2;
    }
    (pSVar9->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
    linearVec3.super_Vector3.m_data[0] = 0.0;
    uVar7 = uVar7 + 1;
    pSVar2 = (SpatialAcc *)
             ((pSVar2->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>
              .linearVec3.super_Vector3.m_data + 1);
  } while (uVar7 != 6);
  iDynTree::FreeFloatingAcc::resize((Model *)&pKVar1->m_invDynGeneralizedProperAccs);
  iDynTree::LinkWrenches::resize((Model *)&this->pimpl->m_invDynNetExtWrenches);
  iDynTree::LinkWrenches::resize((Model *)&this->pimpl->m_invDynInternalWrenches);
  iDynTree::LinkAccArray::resize((Model *)&this->pimpl->m_invDynLinkProperAccs);
  iDynTree::FreeFloatingVel::resize((Model *)&this->pimpl->m_invDynZeroVel);
  puVar3 = (undefined8 *)iDynTree::FreeFloatingVel::baseVel();
  uVar7 = 0;
  puVar5 = puVar3;
  do {
    puVar8 = puVar3 + (ulong)((int)uVar7 - 3) + 3;
    if (uVar7 < 3) {
      puVar8 = puVar5;
    }
    *puVar8 = 0;
    uVar7 = uVar7 + 1;
    puVar5 = puVar5 + 1;
  } while (uVar7 != 6);
  iDynTree::FreeFloatingVel::jointVel();
  iDynTree::VectorDynSize::zero();
  iDynTree::LinkVelArray::resize((Model *)&this->pimpl->m_invDynZeroLinkVel);
  iDynTree::LinkAccArray::resize((Model *)&this->pimpl->m_invDynZeroLinkProperAcc);
  iDynTree::LinkTraversalsCache::resize((Model *)&this->pimpl->m_traversalCache);
  iDynTree::FreeFloatingGeneralizedTorques::resize
            ((Model *)&this->pimpl->m_generalizedForcesContainer);
  lVar4 = iDynTree::Model::getNrOfLinks();
  if (0 < lVar4) {
    lVar4 = 0;
    do {
      puVar3 = (undefined8 *)
               iDynTree::LinkVelArray::operator()(&this->pimpl->m_invDynZeroLinkVel,lVar4);
      uVar7 = 0;
      puVar5 = puVar3;
      do {
        puVar8 = puVar3 + (ulong)((int)uVar7 - 3) + 3;
        if (uVar7 < 3) {
          puVar8 = puVar5;
        }
        *puVar8 = 0;
        uVar7 = uVar7 + 1;
        puVar5 = puVar5 + 1;
      } while (uVar7 != 6);
      lVar4 = lVar4 + 1;
      lVar6 = iDynTree::Model::getNrOfLinks();
    } while (lVar4 < lVar6);
  }
  return;
}

Assistant:

void KinDynComputations::resizeInternalDataStructures()
{
    assert(this->pimpl->m_isModelValid);

    this->pimpl->m_pos.resize(this->pimpl->m_robot_model);
    this->pimpl->m_vel.resize(this->pimpl->m_robot_model);
    this->pimpl->m_linkPos.resize(this->pimpl->m_robot_model);
    this->pimpl->m_linkVel.resize(this->pimpl->m_robot_model);
    this->pimpl->m_linkCRBIs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_rawMassMatrix.resize(this->pimpl->m_robot_model);
    this->pimpl->m_rawMassMatrix.zero();
    this->pimpl->m_jacBuffer.resize(6,6+this->pimpl->m_robot_model.getNrOfDOFs());
    this->pimpl->m_jacBuffer.zero();
    this->pimpl->m_baseBiasAcc.zero();
    this->pimpl->m_linkBiasAcc.resize(this->pimpl->m_robot_model);
    this->pimpl->m_baseAcc.zero();
    this->pimpl->m_generalizedAccs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_linkAccs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynBaseAcc.zero();
    this->pimpl->m_invDynGeneralizedProperAccs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynNetExtWrenches.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynInternalWrenches.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynLinkProperAccs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynZeroVel.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynZeroVel.baseVel().zero();
    this->pimpl->m_invDynZeroVel.jointVel().zero();
    this->pimpl->m_invDynZeroLinkVel.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynZeroLinkProperAcc.resize(this->pimpl->m_robot_model);
    this->pimpl->m_traversalCache.resize(this->pimpl->m_robot_model);
    this->pimpl->m_generalizedForcesContainer.resize(this->pimpl->m_robot_model);

    for(LinkIndex lnkIdx = 0; lnkIdx < static_cast<LinkIndex>(pimpl->m_robot_model.getNrOfLinks()); lnkIdx++)
    {
        pimpl->m_invDynZeroLinkVel(lnkIdx).zero();
    }
}